

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
wallet::anon_unknown_5::WalletImpl::setAddressReceiveRequest
          (WalletImpl *this,CTxDestination *dest,string *id,string *value)

{
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var1;
  CWallet *this_00;
  bool bVar2;
  long in_FS_OFFSET;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  WalletBatch local_50;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  _Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
       (((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_database)._M_t.
       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
       _M_t.
       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
  if (_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
      (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (**(code **)(*(long *)_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
              0x70))(&local_50,
                     _Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1);
  this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50.m_database =
       (WalletDatabase *)_Var1.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (value->_M_string_length == 0) {
    bVar2 = CWallet::EraseAddressReceiveRequest(this_00,&local_50,dest,(string *)id);
  }
  else {
    bVar2 = CWallet::SetAddressReceiveRequest(this_00,&local_50,dest,(string *)id,(string *)value);
  }
  if (local_50.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_50.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool setAddressReceiveRequest(const CTxDestination& dest, const std::string& id, const std::string& value) override {
        // Note: The setAddressReceiveRequest interface used by the GUI to store
        // receive requests is a little awkward and could be improved in the
        // future:
        //
        // - The same method is used to save requests and erase them, but
        //   having separate methods could be clearer and prevent bugs.
        //
        // - Request ids are passed as strings even though they are generated as
        //   integers.
        //
        // - Multiple requests can be stored for the same address, but it might
        //   be better to only allow one request or only keep the current one.
        LOCK(m_wallet->cs_wallet);
        WalletBatch batch{m_wallet->GetDatabase()};
        return value.empty() ? m_wallet->EraseAddressReceiveRequest(batch, dest, id)
                             : m_wallet->SetAddressReceiveRequest(batch, dest, id, value);
    }